

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_avx2.c
# Opt level: O0

void aom_highbd_hadamard_8x8_avx2(int16_t *src_diff,ptrdiff_t src_stride,tran_low_t *coeff)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 (*pauVar9) [16];
  undefined1 (*pauVar10) [16];
  undefined1 (*pauVar11) [16];
  undefined1 (*pauVar12) [16];
  undefined1 (*pauVar13) [16];
  undefined8 *in_RDX;
  long in_RSI;
  undefined1 (*in_RDI) [16];
  __m256i src32 [8];
  __m128i src16 [8];
  undefined8 local_480;
  undefined8 uStackY_478;
  undefined8 uStackY_470;
  undefined8 uStackY_468;
  undefined8 local_460;
  undefined8 uStackY_458;
  undefined8 uStackY_450;
  undefined8 uStackY_448;
  undefined8 local_440;
  undefined8 uStackY_438;
  undefined8 uStackY_430;
  undefined8 uStackY_428;
  undefined8 local_420;
  undefined8 uStackY_418;
  undefined8 uStackY_410;
  undefined8 uStackY_408;
  undefined8 local_400;
  undefined8 uStackY_3f8;
  undefined8 uStackY_3f0;
  undefined8 uStackY_3e8;
  undefined8 local_3e0;
  undefined8 uStackY_3d8;
  undefined8 uStackY_3d0;
  undefined8 uStackY_3c8;
  undefined8 local_3c0;
  undefined8 uStackY_3b8;
  undefined8 uStackY_3b0;
  undefined8 uStackY_3a8;
  undefined8 local_3a0;
  undefined8 uStackY_398;
  undefined8 uStackY_390;
  undefined8 uStackY_388;
  int in_stack_fffffffffffffd8c;
  __m256i *in_stack_fffffffffffffd90;
  
  pauVar9 = (undefined1 (*) [16])(*(undefined1 (*) [16])(*in_RDI + in_RSI * 2) + in_RSI * 2);
  pauVar10 = (undefined1 (*) [16])(*pauVar9 + in_RSI * 2);
  pauVar11 = (undefined1 (*) [16])(*pauVar10 + in_RSI * 2);
  pauVar12 = (undefined1 (*) [16])(*pauVar11 + in_RSI * 2);
  pauVar13 = (undefined1 (*) [16])(*pauVar12 + in_RSI * 2);
  auVar1 = vpmovsxwd_avx2(*in_RDI);
  auVar2 = vpmovsxwd_avx2(*(undefined1 (*) [16])(*in_RDI + in_RSI * 2));
  auVar3 = vpmovsxwd_avx2(*pauVar9);
  auVar4 = vpmovsxwd_avx2(*pauVar10);
  auVar5 = vpmovsxwd_avx2(*pauVar11);
  auVar6 = vpmovsxwd_avx2(*pauVar12);
  auVar7 = vpmovsxwd_avx2(*pauVar13);
  auVar8 = vpmovsxwd_avx2(*(undefined1 (*) [16])(*pauVar13 + in_RSI * 2));
  highbd_hadamard_col8_avx2(in_stack_fffffffffffffd90,in_stack_fffffffffffffd8c);
  highbd_hadamard_col8_avx2(in_stack_fffffffffffffd90,in_stack_fffffffffffffd8c);
  local_480 = auVar1._0_8_;
  uStackY_478 = auVar1._8_8_;
  uStackY_470 = auVar1._16_8_;
  uStackY_468 = auVar1._24_8_;
  *in_RDX = local_480;
  in_RDX[1] = uStackY_478;
  in_RDX[2] = uStackY_470;
  in_RDX[3] = uStackY_468;
  local_460 = auVar2._0_8_;
  uStackY_458 = auVar2._8_8_;
  uStackY_450 = auVar2._16_8_;
  uStackY_448 = auVar2._24_8_;
  in_RDX[4] = local_460;
  in_RDX[5] = uStackY_458;
  in_RDX[6] = uStackY_450;
  in_RDX[7] = uStackY_448;
  local_440 = auVar3._0_8_;
  uStackY_438 = auVar3._8_8_;
  uStackY_430 = auVar3._16_8_;
  uStackY_428 = auVar3._24_8_;
  in_RDX[8] = local_440;
  in_RDX[9] = uStackY_438;
  in_RDX[10] = uStackY_430;
  in_RDX[0xb] = uStackY_428;
  local_420 = auVar4._0_8_;
  uStackY_418 = auVar4._8_8_;
  uStackY_410 = auVar4._16_8_;
  uStackY_408 = auVar4._24_8_;
  in_RDX[0xc] = local_420;
  in_RDX[0xd] = uStackY_418;
  in_RDX[0xe] = uStackY_410;
  in_RDX[0xf] = uStackY_408;
  local_400 = auVar5._0_8_;
  uStackY_3f8 = auVar5._8_8_;
  uStackY_3f0 = auVar5._16_8_;
  uStackY_3e8 = auVar5._24_8_;
  in_RDX[0x10] = local_400;
  in_RDX[0x11] = uStackY_3f8;
  in_RDX[0x12] = uStackY_3f0;
  in_RDX[0x13] = uStackY_3e8;
  local_3e0 = auVar6._0_8_;
  uStackY_3d8 = auVar6._8_8_;
  uStackY_3d0 = auVar6._16_8_;
  uStackY_3c8 = auVar6._24_8_;
  in_RDX[0x14] = local_3e0;
  in_RDX[0x15] = uStackY_3d8;
  in_RDX[0x16] = uStackY_3d0;
  in_RDX[0x17] = uStackY_3c8;
  local_3c0 = auVar7._0_8_;
  uStackY_3b8 = auVar7._8_8_;
  uStackY_3b0 = auVar7._16_8_;
  uStackY_3a8 = auVar7._24_8_;
  in_RDX[0x18] = local_3c0;
  in_RDX[0x19] = uStackY_3b8;
  in_RDX[0x1a] = uStackY_3b0;
  in_RDX[0x1b] = uStackY_3a8;
  local_3a0 = auVar8._0_8_;
  uStackY_398 = auVar8._8_8_;
  uStackY_390 = auVar8._16_8_;
  uStackY_388 = auVar8._24_8_;
  in_RDX[0x1c] = local_3a0;
  in_RDX[0x1d] = uStackY_398;
  in_RDX[0x1e] = uStackY_390;
  in_RDX[0x1f] = uStackY_388;
  return;
}

Assistant:

void aom_highbd_hadamard_8x8_avx2(const int16_t *src_diff, ptrdiff_t src_stride,
                                  tran_low_t *coeff) {
  __m128i src16[8];
  __m256i src32[8];

  src16[0] = _mm_loadu_si128((const __m128i *)src_diff);
  src16[1] = _mm_loadu_si128((const __m128i *)(src_diff += src_stride));
  src16[2] = _mm_loadu_si128((const __m128i *)(src_diff += src_stride));
  src16[3] = _mm_loadu_si128((const __m128i *)(src_diff += src_stride));
  src16[4] = _mm_loadu_si128((const __m128i *)(src_diff += src_stride));
  src16[5] = _mm_loadu_si128((const __m128i *)(src_diff += src_stride));
  src16[6] = _mm_loadu_si128((const __m128i *)(src_diff += src_stride));
  src16[7] = _mm_loadu_si128((const __m128i *)(src_diff + src_stride));

  src32[0] = _mm256_cvtepi16_epi32(src16[0]);
  src32[1] = _mm256_cvtepi16_epi32(src16[1]);
  src32[2] = _mm256_cvtepi16_epi32(src16[2]);
  src32[3] = _mm256_cvtepi16_epi32(src16[3]);
  src32[4] = _mm256_cvtepi16_epi32(src16[4]);
  src32[5] = _mm256_cvtepi16_epi32(src16[5]);
  src32[6] = _mm256_cvtepi16_epi32(src16[6]);
  src32[7] = _mm256_cvtepi16_epi32(src16[7]);

  highbd_hadamard_col8_avx2(src32, 0);
  highbd_hadamard_col8_avx2(src32, 1);

  _mm256_storeu_si256((__m256i *)coeff, src32[0]);
  coeff += 8;
  _mm256_storeu_si256((__m256i *)coeff, src32[1]);
  coeff += 8;
  _mm256_storeu_si256((__m256i *)coeff, src32[2]);
  coeff += 8;
  _mm256_storeu_si256((__m256i *)coeff, src32[3]);
  coeff += 8;
  _mm256_storeu_si256((__m256i *)coeff, src32[4]);
  coeff += 8;
  _mm256_storeu_si256((__m256i *)coeff, src32[5]);
  coeff += 8;
  _mm256_storeu_si256((__m256i *)coeff, src32[6]);
  coeff += 8;
  _mm256_storeu_si256((__m256i *)coeff, src32[7]);
}